

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O3

void initSearchPaths(void)

{
  char *pcVar1;
  istream *piVar2;
  long lVar3;
  string searchPaths;
  string item;
  stringstream ss;
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  string local_1d0;
  stringstream local_1b0 [128];
  ios_base local_130 [264];
  
  local_1e8 = 0;
  local_1e0[0] = 0;
  local_1f0 = local_1e0;
  pcVar1 = getenv("DYLD_LIBRARY_PATH");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("DYLD_FALLBACK_FRAMEWORK_PATH");
    if (pcVar1 != (char *)0x0) goto LAB_00105e75;
    pcVar1 = getenv("DYLD_FALLBACK_LIBRARY_PATH");
    if (pcVar1 == (char *)0x0) goto LAB_00105f9f;
LAB_00105ed8:
    std::__cxx11::string::append((char *)&local_1f0);
    lVar3 = local_1e8;
  }
  else {
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_1f0,0,(char *)0x0,(ulong)pcVar1);
    lVar3 = local_1e8;
    pcVar1 = getenv("DYLD_FALLBACK_FRAMEWORK_PATH");
    if (pcVar1 != (char *)0x0) {
      if ((lVar3 != 0) && (local_1f0[lVar3 + -1] != ':')) {
        std::__cxx11::string::append((char *)&local_1f0);
      }
LAB_00105e75:
      std::__cxx11::string::append((char *)&local_1f0);
      lVar3 = local_1e8;
    }
    pcVar1 = getenv("DYLD_FALLBACK_LIBRARY_PATH");
    if (pcVar1 != (char *)0x0) {
      if ((lVar3 != 0) && (local_1f0[lVar3 + -1] != ':')) {
        std::__cxx11::string::append((char *)&local_1f0);
      }
      goto LAB_00105ed8;
    }
  }
  if (lVar3 != 0) {
    std::__cxx11::stringstream::stringstream(local_1b0,(string *)&local_1f0,_S_out|_S_in);
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_local_buf[0] = '\0';
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b0,(string *)&local_1d0,':');
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      if (local_1d0._M_dataplus._M_p[local_1d0._M_string_length - 1] != '/') {
        std::__cxx11::string::append((char *)&local_1d0);
      }
      Settings::addSearchPath(&local_1d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
  }
LAB_00105f9f:
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  return;
}

Assistant:

void Dependency::copyYourself()
{
    copyFile(getOriginalPath(), getInstallPath());
    
    // Fix the lib's inner name
    std::string command = std::string("install_name_tool -id \"") + getInnerPath() + "\" \"" + getInstallPath() + "\"";
    if( systemp( command ) != 0 )
    {
        std::cerr << "\n\nError : An error occured while trying to change identity of library " << getInstallPath() << std::endl;
        exit(1);
    }
}